

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c1a11d::LevelTest_TestTargetLevel0_Test::TestBody
          (LevelTest_TestTargetLevel0_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *message;
  string *in_RDI;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int target_level;
  I420VideoSource video;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffee4;
  int *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  allocator *file;
  Type TVar4;
  HasNewFatalFailureHelper *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  TestPartResultReporterInterface *in_stack_ffffffffffffff58;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff64;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  if (*(int *)((long)&in_RDI[0x1f].field_2 + 8) != 4) {
    return;
  }
  file = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",file);
  uVar3 = 0x32;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_ffffffffffffff10,in_RDI,(uint)((ulong)file >> 0x20),
             (uint)file,
             CONCAT13(in_stack_fffffffffffffeff,
                      CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)),
             in_stack_fffffffffffffef8,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  uVar5 = 0;
  *(undefined4 *)((long)&in_RDI[0x1f].field_2 + 0xc) = 0;
  *(undefined4 *)((long)&in_RDI[5].field_2 + 8) = 4000;
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_ffffffffffffff10)
    ;
    in_stack_fffffffffffffefe = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffefe) {
      (**(code **)(*(long *)((long)&in_RDI->field_2 + 8) + 0x10))
                ((undefined1 *)((long)&in_RDI->field_2 + 8),local_68);
    }
    bVar2 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)&stack0xffffffffffffff48);
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
    TVar4 = (Type)((ulong)in_RDI >> 0x20);
    if (!bVar2) {
      testing::internal::CmpHelperLE<int,int>
                ((char *)((ulong)CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffefe,
                                                         in_stack_fffffffffffffefc)) << 0x20),
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (int *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
      bVar2 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff20);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff10);
        message = testing::AssertionResult::failure_message((AssertionResult *)0x8b1b66);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_ffffffffffffff10,TVar4,(char *)file,
                   CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)),
                   message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff64,uVar5),
                   (Message *)in_stack_ffffffffffffff58);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
        testing::Message::~Message((Message *)0x8b1bb4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8b1c26);
      goto LAB_008b1c38;
    }
    if (!bVar2) goto LAB_008b1c38;
  }
  TVar4 = (Type)((ulong)in_RDI >> 0x20);
  testing::Message::Message((Message *)in_stack_ffffffffffffff10);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff10,TVar4,(char *)file,
             CONCAT13(uVar1,CONCAT12(in_stack_fffffffffffffefe,in_stack_fffffffffffffefc)),
             in_stack_fffffffffffffef0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff64,uVar5),
             (Message *)in_stack_ffffffffffffff58);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffee4,uVar3));
  testing::Message::~Message((Message *)0x8b1abd);
LAB_008b1c38:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x8b1c45);
  return;
}

Assistant:

TEST_P(LevelTest, TestTargetLevel0) {
  // To save run time, we only test speed 4.
  if (cpu_used_ == 4) {
    libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 50);
    const int target_level = 0;
    target_level_ = target_level;
    cfg_.rc_target_bitrate = 4000;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_LE(level_[0], target_level);
  }
}